

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O3

void gray_set_cell(gray_PWorker worker,TCoord ex,TCoord ey)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = worker->min_ex + -1;
  if (worker->min_ex <= ex) {
    iVar2 = ex;
  }
  if ((worker->invalid == 0) && ((worker->area != 0 || (worker->cover != 0)))) {
    gray_record_cell(worker);
  }
  worker->area = 0;
  worker->cover = 0;
  worker->ex = iVar2;
  worker->ey = ey;
  uVar1 = 1;
  if ((ey < worker->max_ey) && (worker->min_ey <= ey)) {
    uVar1 = (uint)(worker->max_ex <= iVar2);
  }
  worker->invalid = uVar1;
  return;
}

Assistant:

static void
  gray_set_cell( RAS_ARG_ TCoord  ex,
                          TCoord  ey )
  {
    /* Move the cell pointer to a new position.  We set the `invalid'      */
    /* flag to indicate that the cell isn't part of those we're interested */
    /* in during the render phase.  This means that:                       */
    /*                                                                     */
    /* . the new vertical position must be within min_ey..max_ey-1.        */
    /* . the new horizontal position must be strictly less than max_ex     */
    /*                                                                     */
    /* Note that if a cell is to the left of the clipping region, it is    */
    /* actually set to the (min_ex-1) horizontal position.                 */

    if ( ex < ras.min_ex )
      ex = ras.min_ex - 1;

    /* record the current one if it is valid and substantial */
    if ( !ras.invalid && ( ras.area || ras.cover ) )
      gray_record_cell( RAS_VAR );

    ras.area  = 0;
    ras.cover = 0;
    ras.ex    = ex;
    ras.ey    = ey;

    ras.invalid = ( ey >= ras.max_ey || ey < ras.min_ey ||
                    ex >= ras.max_ex );
  }